

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testfade.cpp
# Opt level: O1

int main(void)

{
  Am_Slot_Key AVar1;
  ushort uVar2;
  char *pcVar3;
  Am_Constraint *pAVar4;
  Am_Wrapper *pAVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  Am_Object *pAVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  Am_Point_List *this;
  Am_Value_List *pAVar12;
  Am_Object aAStack_228 [8];
  Am_Object local_220 [8];
  Am_Object local_218 [8];
  Am_Object local_210 [8];
  Am_Object local_208 [8];
  Am_Object local_200 [8];
  Am_Object local_1f8 [8];
  Am_Object local_1f0 [8];
  Am_Object local_1e8 [8];
  Am_Object local_1e0 [8];
  Am_Object local_1d8 [8];
  Am_Object local_1d0 [8];
  Am_Object local_1c8 [8];
  Am_Object local_1c0 [8];
  Am_Object local_1b8 [8];
  Am_Object local_1b0 [8];
  Am_Style local_1a8 [8];
  Am_Object local_1a0 [8];
  Am_Object local_198 [8];
  Am_Object local_190 [8];
  Am_Object local_188 [8];
  Am_Object local_180 [8];
  Am_Object local_178 [8];
  Am_Object local_170 [8];
  Am_Object local_168 [8];
  Am_Object local_160 [8];
  Am_Object local_158 [8];
  Am_Object local_150 [8];
  Am_Object local_148 [8];
  Am_Object local_140 [8];
  Am_Object local_138 [8];
  Am_Object local_130 [8];
  Am_Object local_128 [8];
  Am_Object local_120 [8];
  Am_Object local_118 [8];
  Am_Object local_110 [8];
  Am_Object local_108 [8];
  Am_Object local_100 [8];
  Am_Object local_f8 [8];
  Am_Object local_f0 [8];
  Am_Object local_e8 [8];
  Am_Object local_e0 [8];
  Am_Object local_d8 [8];
  Am_Object local_d0 [8];
  Am_Object local_c8 [8];
  Am_Object local_c0 [8];
  Am_Object local_b8 [8];
  Am_Object local_b0 [8];
  Am_Object local_a8 [8];
  Am_Object local_a0 [8];
  Am_Object local_98 [8];
  Am_Image_Array ship_image;
  Am_Image_Array local_88 [8];
  Am_Value_List local_80 [16];
  Am_Value_List local_70 [16];
  Am_Point_List local_60 [16];
  Am_Formula local_50 [16];
  Am_Formula local_40 [16];
  
  Am_Initialize();
  pcVar3 = (char *)Am_Merge_Pathname("images/ent.gif");
  Am_Image_Array::Am_Image_Array(&ship_image,pcVar3);
  Am_Object::Create((char *)local_a0);
  pAVar4 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)&Am_Width_Of_Parts);
  uVar2 = Am_Object::Set((ushort)local_a0,(Am_Constraint *)0x66,(ulong)pAVar4);
  pAVar4 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)&Am_Height_Of_Parts);
  uVar2 = Am_Object::Set(uVar2,(Am_Constraint *)0x67,(ulong)pAVar4);
  uVar2 = Am_Object::Set(uVar2,true,1);
  pAVar5 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Amulet_Purple);
  uVar6 = Am_Object::Set(uVar2,(Am_Wrapper *)0x6a,(ulong)pAVar5);
  Am_Object::Create((char *)local_b0);
  pAVar4 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)&Am_Width_Of_Parts);
  uVar2 = Am_Object::Set((ushort)local_b0,(Am_Constraint *)0x66,(ulong)pAVar4);
  pAVar4 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)&Am_Height_Of_Parts);
  uVar2 = Am_Object::Set(uVar2,(Am_Constraint *)0x67,(ulong)pAVar4);
  pAVar4 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)&Am_Horizontal_Layout);
  uVar2 = Am_Object::Set(uVar2,(Am_Constraint *)0x94,(ulong)pAVar4);
  uVar2 = Am_Object::Set(uVar2,0x9e,10);
  uVar2 = Am_Object::Set(uVar2,0x9f,10);
  uVar2 = Am_Object::Set(uVar2,0x95,10);
  uVar2 = Am_Object::Set(uVar2,0xa0,10);
  uVar7 = Am_Object::Set(uVar2,0xa1,10);
  AVar1 = SCROLL_PART;
  Am_Object::Create((char *)local_c0);
  uVar2 = Am_Object::Set((ushort)local_c0,0x67,300);
  uVar2 = Am_Object::Set(uVar2,0x182,99);
  pAVar8 = (Am_Object *)Am_Object::Set(uVar2,0x169,0);
  Am_Object::Am_Object(local_b8,pAVar8);
  uVar7 = Am_Object::Add_Part(uVar7,AVar1,local_b8,0);
  Am_Object::Create((char *)local_d0);
  uVar2 = Am_Object::Set((ushort)local_d0,0x66,300);
  uVar2 = Am_Object::Set(uVar2,0x67,300);
  Am_From_Sibling((ushort)local_40,SCROLL_PART);
  pAVar4 = Am_Formula::operator_cast_to_Am_Constraint_(local_40);
  uVar9 = Am_Object::Add(uVar2,(Am_Constraint *)0x169,(ulong)pAVar4);
  Am_Object::Create((char *)local_e0);
  uVar2 = Am_Object::Set((ushort)local_e0,0x66,300);
  uVar10 = Am_Object::Set(uVar2,0x67,300);
  Am_Object::Create((char *)local_f0);
  uVar2 = Am_Object::Set((ushort)local_f0,100,100);
  uVar2 = Am_Object::Set(uVar2,0x65,100);
  uVar2 = Am_Object::Set(uVar2,0x66,100);
  uVar2 = Am_Object::Set(uVar2,0x67,100);
  pAVar5 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Cyan);
  pAVar8 = (Am_Object *)Am_Object::Set(uVar2,(Am_Wrapper *)0x6a,(ulong)pAVar5);
  Am_Object::Am_Object(local_e8,pAVar8);
  uVar10 = Am_Object::Add_Part(uVar10,local_e8,1,0);
  Am_Object::Create((char *)local_100);
  uVar2 = Am_Object::Set((ushort)local_100,100,0x96);
  pAVar8 = (Am_Object *)Am_Object::Set(uVar2,0x65,0xaf);
  Am_Object::Am_Object(local_f8,pAVar8);
  pAVar8 = (Am_Object *)Am_Object::Add_Part(uVar10,local_f8,1,0);
  Am_Object::Am_Object(local_d8,pAVar8);
  uVar9 = Am_Object::Add_Part(uVar9,local_d8,1,0);
  Am_Object::Create((char *)local_110);
  uVar2 = Am_Object::Set((ushort)local_110,0x66,300);
  uVar2 = Am_Object::Set(uVar2,0x67,300);
  Am_From_Owner((ushort)local_50);
  pAVar4 = Am_Formula::operator_cast_to_Am_Constraint_(local_50);
  uVar10 = Am_Object::Set(uVar2,(Am_Constraint *)0x169,(ulong)pAVar4);
  Am_Object::Create((char *)local_120);
  pAVar4 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)&Am_Width_Of_Parts);
  uVar2 = Am_Object::Set((ushort)local_120,(Am_Constraint *)0x66,(ulong)pAVar4);
  pAVar4 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)&Am_Height_Of_Parts);
  uVar11 = Am_Object::Set(uVar2,(Am_Constraint *)0x67,(ulong)pAVar4);
  Am_Object::Create((char *)local_130);
  uVar2 = Am_Object::Set((ushort)local_130,0x66,100);
  uVar2 = Am_Object::Set(uVar2,0x67,100);
  pAVar5 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Blue);
  pAVar8 = (Am_Object *)Am_Object::Set(uVar2,(Am_Wrapper *)0x6a,(ulong)pAVar5);
  Am_Object::Am_Object(local_128,pAVar8);
  uVar11 = Am_Object::Add_Part(uVar11,local_128,1,0);
  Am_Object::Create((char *)local_140);
  uVar2 = Am_Object::Set((ushort)local_140,100,0x4b);
  uVar2 = Am_Object::Set(uVar2,0x65,0xaf);
  uVar2 = Am_Object::Set(uVar2,0x66,0x96);
  uVar2 = Am_Object::Set(uVar2,0x67,100);
  pAVar5 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Red);
  pAVar8 = (Am_Object *)Am_Object::Set(uVar2,(Am_Wrapper *)0x6a,(ulong)pAVar5);
  Am_Object::Am_Object(local_138,pAVar8);
  pAVar8 = (Am_Object *)Am_Object::Add_Part(uVar11,local_138,1,0);
  Am_Object::Am_Object(local_118,pAVar8);
  uVar10 = Am_Object::Add_Part(uVar10,local_118,1,0);
  Am_Object::Create((char *)local_150);
  uVar2 = Am_Object::Set((ushort)local_150,0x8b,300);
  uVar2 = Am_Object::Set(uVar2,0x8c,0);
  uVar2 = Am_Object::Set(uVar2,0x8d,0);
  uVar2 = Am_Object::Set(uVar2,0x8e,300);
  pAVar5 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Green);
  pAVar8 = (Am_Object *)Am_Object::Set(uVar2,(Am_Wrapper *)0x6b,(ulong)pAVar5);
  Am_Object::Am_Object(local_148,pAVar8);
  uVar10 = Am_Object::Add_Part(uVar10,local_148,1,0);
  Am_Object::Create((char *)local_160);
  uVar2 = Am_Object::Set((ushort)local_160,0x8b,200);
  uVar2 = Am_Object::Set(uVar2,0x8c,0);
  uVar2 = Am_Object::Set(uVar2,0x8d,0);
  uVar2 = Am_Object::Set(uVar2,0x8e,200);
  pAVar5 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Purple);
  pAVar8 = (Am_Object *)Am_Object::Set(uVar2,(Am_Wrapper *)0x6b,(ulong)pAVar5);
  Am_Object::Am_Object(local_158,pAVar8);
  uVar10 = Am_Object::Add_Part(uVar10,local_158,1,0);
  Am_Object::Create((char *)local_170);
  uVar2 = Am_Object::Set((ushort)local_170,0x66,100);
  uVar2 = Am_Object::Set(uVar2,0x67,100);
  Am_Point_List::Am_Point_List(local_60);
  uVar11 = Am_Point_List::Add(0x432a0000,0x42480000,local_60,1,1);
  uVar11 = Am_Point_List::Add(0x43480000,0x41200000,uVar11,1,1);
  this = (Am_Point_List *)Am_Point_List::Add(0x43660000,uVar11,1,1);
  pAVar5 = Am_Point_List::operator_cast_to_Am_Wrapper_(this);
  uVar2 = Am_Object::Set(uVar2,(Am_Wrapper *)0xb2,(ulong)pAVar5);
  pAVar5 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Line_2);
  uVar2 = Am_Object::Set(uVar2,(Am_Wrapper *)0x6b,(ulong)pAVar5);
  pAVar5 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_No_Style);
  pAVar8 = (Am_Object *)Am_Object::Set(uVar2,(Am_Wrapper *)0x6a,(ulong)pAVar5);
  Am_Object::Am_Object(local_168,pAVar8);
  uVar10 = Am_Object::Add_Part(uVar10,local_168,1,0);
  Am_Object::Create((char *)local_180);
  uVar2 = Am_Object::Set((ushort)local_180,100,200);
  uVar2 = Am_Object::Set(uVar2,0x65,0x96);
  uVar2 = Am_Object::Set(uVar2,0x66,100);
  uVar2 = Am_Object::Set(uVar2,0x67,100);
  pAVar5 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Opaque_Diamond_Stipple);
  pAVar8 = (Am_Object *)Am_Object::Set(uVar2,(Am_Wrapper *)0x6a,(ulong)pAVar5);
  Am_Object::Am_Object(local_178,pAVar8);
  uVar10 = Am_Object::Add_Part(uVar10,local_178,1,0);
  Am_Object::Create((char *)local_190);
  uVar2 = Am_Object::Set((ushort)local_190,100,0xaf);
  uVar2 = Am_Object::Set(uVar2,0x65,100);
  pAVar5 = Am_Image_Array::operator_cast_to_Am_Wrapper_(&ship_image);
  uVar2 = Am_Object::Set(uVar2,(Am_Wrapper *)0xb0,(ulong)pAVar5);
  pAVar5 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Orange);
  uVar2 = Am_Object::Set(uVar2,(Am_Wrapper *)0x6b,(ulong)pAVar5);
  pAVar8 = (Am_Object *)Am_Object::Set(uVar2,true,1);
  Am_Object::Am_Object(local_188,pAVar8);
  uVar10 = Am_Object::Add_Part(uVar10,local_188,1,0);
  Am_Object::Create((char *)local_1a0);
  uVar2 = Am_Object::Set((ushort)local_1a0,0x8b,0x32);
  uVar2 = Am_Object::Set(uVar2,0x8c,0x96);
  uVar2 = Am_Object::Set(uVar2,0x8d,0x96);
  uVar2 = Am_Object::Set(uVar2,0x8e,0xfa);
  Am_Image_Array::Am_Image_Array(local_88,(Am_Image_Array *)&Am_No_Image);
  Am_Style::Am_Style((Am_Style *)0x0,0,0x3f800000,local_1a8,4,1,0,1,"\x02\x02",2,0,0,local_88);
  pAVar5 = Am_Style::operator_cast_to_Am_Wrapper_(local_1a8);
  pAVar8 = (Am_Object *)Am_Object::Set(uVar2,(Am_Wrapper *)0x6b,(ulong)pAVar5);
  Am_Object::Am_Object(local_198,pAVar8);
  uVar10 = Am_Object::Add_Part(uVar10,local_198,1,0);
  Am_Object::Create((char *)local_1b8);
  uVar2 = Am_Object::Set((ushort)local_1b8,(char *)0xab,0x10403e);
  uVar2 = Am_Object::Set(uVar2,100,0xb4);
  pAVar8 = (Am_Object *)Am_Object::Set(uVar2,0x65,0x1e);
  Am_Object::Am_Object(local_1b0,pAVar8);
  uVar10 = Am_Object::Add_Part(uVar10,local_1b0,1,0);
  Am_Object::Create((char *)local_1c8);
  uVar2 = Am_Object::Set((ushort)local_1c8,0x65,0x6e);
  uVar2 = Am_Object::Set(uVar2,100,0x14);
  Am_Value_List::Am_Value_List(local_70);
  uVar11 = Am_Value_List::Add(local_70,"Radio",1,1);
  pAVar12 = (Am_Value_List *)Am_Value_List::Add(uVar11,"Buttons",1,1);
  pAVar5 = Am_Value_List::operator_cast_to_Am_Wrapper_(pAVar12);
  pAVar8 = (Am_Object *)Am_Object::Set(uVar2,(Am_Wrapper *)0xa2,(ulong)pAVar5);
  Am_Object::Am_Object(local_1c0,pAVar8);
  uVar10 = Am_Object::Add_Part(uVar10,local_1c0,1,0);
  Am_Object::Create((char *)local_1d8);
  uVar2 = Am_Object::Set((ushort)local_1d8,0x65,0x96);
  uVar2 = Am_Object::Set(uVar2,100,0x14);
  Am_Value_List::Am_Value_List(local_80);
  uVar11 = Am_Value_List::Add(local_80,"Check",1,1);
  pAVar12 = (Am_Value_List *)Am_Value_List::Add(uVar11,"Boxes",1);
  pAVar5 = Am_Value_List::operator_cast_to_Am_Wrapper_(pAVar12);
  pAVar8 = (Am_Object *)Am_Object::Set(uVar2,(Am_Wrapper *)0xa2,(ulong)pAVar5);
  Am_Object::Am_Object(local_1d0,pAVar8);
  uVar10 = Am_Object::Add_Part(uVar10,local_1d0,1,0);
  Am_Object::Create((char *)local_1e8);
  uVar2 = Am_Object::Set((ushort)local_1e8,0x65,200);
  pAVar8 = (Am_Object *)Am_Object::Set(uVar2,100,0x14);
  Am_Object::Am_Object(local_1e0,pAVar8);
  uVar10 = Am_Object::Add_Part(uVar10,local_1e0,1,0);
  Am_Object::Create((char *)local_1f8);
  uVar2 = Am_Object::Set((ushort)local_1f8,0x65,0xf0);
  uVar2 = Am_Object::Set(uVar2,100,0x14);
  pAVar8 = (Am_Object *)Am_Object::Set(uVar2,true,0);
  Am_Object::Am_Object(local_1f0,pAVar8);
  uVar10 = Am_Object::Add_Part(uVar10,local_1f0,1,0);
  Am_Object::Create((char *)local_208);
  uVar2 = Am_Object::Set((ushort)local_208,0x65,0x118);
  pAVar8 = (Am_Object *)Am_Object::Set(uVar2,100,0x14);
  Am_Object::Am_Object(local_200,pAVar8);
  pAVar8 = (Am_Object *)Am_Object::Add_Part(uVar10,local_200,1,0);
  Am_Object::Am_Object(local_108,pAVar8);
  uVar9 = Am_Object::Add_Part(uVar9,local_108,1,0);
  Am_Object::Create((char *)local_218);
  uVar2 = Am_Object::Set((ushort)local_218,100,0xaf);
  uVar2 = Am_Object::Set(uVar2,0x65,0x96);
  uVar2 = Am_Object::Set(uVar2,0x66,100);
  uVar2 = Am_Object::Set(uVar2,0x67,100);
  pAVar5 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Purple);
  pAVar8 = (Am_Object *)Am_Object::Set(uVar2,(Am_Wrapper *)0x6a,(ulong)pAVar5);
  Am_Object::Am_Object(local_210,pAVar8);
  uVar9 = Am_Object::Add_Part(uVar9,local_210,1,0);
  Am_Object::Create((char *)aAStack_228);
  uVar2 = Am_Object::Set((ushort)aAStack_228,100,10);
  pAVar8 = (Am_Object *)Am_Object::Set(uVar2,0x65,0x32);
  Am_Object::Am_Object(local_220,pAVar8);
  pAVar8 = (Am_Object *)Am_Object::Add_Part(uVar9,local_220,1,0);
  Am_Object::Am_Object(local_c8,pAVar8);
  pAVar8 = (Am_Object *)Am_Object::Add_Part(uVar7,local_c8,1,0);
  Am_Object::Am_Object(local_a8,pAVar8);
  pAVar8 = (Am_Object *)Am_Object::Add_Part(uVar6,local_a8,1,0);
  Am_Object::Am_Object(local_98,pAVar8);
  Am_Object::Add_Part(&Am_Screen,local_98,1,0);
  Am_Object::~Am_Object(local_98);
  Am_Object::~Am_Object(local_a8);
  Am_Object::~Am_Object(local_c8);
  Am_Object::~Am_Object(local_220);
  Am_Object::~Am_Object(aAStack_228);
  Am_Object::~Am_Object(local_210);
  Am_Object::~Am_Object(local_218);
  Am_Object::~Am_Object(local_108);
  Am_Object::~Am_Object(local_200);
  Am_Object::~Am_Object(local_208);
  Am_Object::~Am_Object(local_1f0);
  Am_Object::~Am_Object(local_1f8);
  Am_Object::~Am_Object(local_1e0);
  Am_Object::~Am_Object(local_1e8);
  Am_Object::~Am_Object(local_1d0);
  Am_Value_List::~Am_Value_List(local_80);
  Am_Object::~Am_Object(local_1d8);
  Am_Object::~Am_Object(local_1c0);
  Am_Value_List::~Am_Value_List(local_70);
  Am_Object::~Am_Object(local_1c8);
  Am_Object::~Am_Object(local_1b0);
  Am_Object::~Am_Object(local_1b8);
  Am_Object::~Am_Object(local_198);
  Am_Style::~Am_Style(local_1a8);
  Am_Image_Array::~Am_Image_Array(local_88);
  Am_Object::~Am_Object(local_1a0);
  Am_Object::~Am_Object(local_188);
  Am_Object::~Am_Object(local_190);
  Am_Object::~Am_Object(local_178);
  Am_Object::~Am_Object(local_180);
  Am_Object::~Am_Object(local_168);
  Am_Point_List::~Am_Point_List(local_60);
  Am_Object::~Am_Object(local_170);
  Am_Object::~Am_Object(local_158);
  Am_Object::~Am_Object(local_160);
  Am_Object::~Am_Object(local_148);
  Am_Object::~Am_Object(local_150);
  Am_Object::~Am_Object(local_118);
  Am_Object::~Am_Object(local_138);
  Am_Object::~Am_Object(local_140);
  Am_Object::~Am_Object(local_128);
  Am_Object::~Am_Object(local_130);
  Am_Object::~Am_Object(local_120);
  Am_Formula::~Am_Formula(local_50);
  Am_Object::~Am_Object(local_110);
  Am_Object::~Am_Object(local_d8);
  Am_Object::~Am_Object(local_f8);
  Am_Object::~Am_Object(local_100);
  Am_Object::~Am_Object(local_e8);
  Am_Object::~Am_Object(local_f0);
  Am_Object::~Am_Object(local_e0);
  Am_Formula::~Am_Formula(local_40);
  Am_Object::~Am_Object(local_d0);
  Am_Object::~Am_Object(local_b8);
  Am_Object::~Am_Object(local_c0);
  Am_Object::~Am_Object(local_b0);
  Am_Object::~Am_Object(local_a0);
  Am_Main_Event_Loop();
  Am_Cleanup();
  Am_Image_Array::~Am_Image_Array(&ship_image);
  return 0;
}

Assistant:

int
main(void)
{
  static const char Am_DOTTED_DASH_LIST[2] = {2, 2};

  Am_Initialize();

  Am_Image_Array ship_image(Am_Merge_Pathname(IMFN_FEDERATION));

  Am_Screen.Add_Part(
      Am_Window.Create("main window")
          .Set(Am_WIDTH, Am_Width_Of_Parts)
          .Set(Am_HEIGHT, Am_Height_Of_Parts)
          .Set(Am_QUERY_POSITION, true)
          .Set(Am_FILL_STYLE, Am_Amulet_Purple)
          .Add_Part(
              Am_Group.Create()
                  .Set(Am_WIDTH, Am_Width_Of_Parts)
                  .Set(Am_HEIGHT, Am_Height_Of_Parts)
                  .Set(Am_LAYOUT, Am_Horizontal_Layout)
                  .Set(Am_LEFT_OFFSET, 10)
                  .Set(Am_TOP_OFFSET, 10)
                  .Set(Am_H_SPACING, 10)
                  .Set(Am_RIGHT_OFFSET, 10)
                  .Set(Am_BOTTOM_OFFSET, 10)
                  .Add_Part(SCROLL_PART, Am_Vertical_Scroll_Bar.Create()
                                             .Set(Am_HEIGHT, 300)
                                             .Set(Am_VALUE_2, 99)
                                             .Set(Am_VALUE, 0))
                  .Add_Part(
                      Am_Group.Create()
                          .Set(Am_WIDTH, 300)
                          .Set(Am_HEIGHT, 300)
                          .Add(Am_VALUE, Am_From_Sibling(SCROLL_PART, Am_VALUE))
                          .Add_Part(
                              Am_Group.Create()
                                  .Set(Am_WIDTH, 300)
                                  .Set(Am_HEIGHT, 300)
                                  .Add_Part(Am_Rectangle.Create()
                                                .Set(Am_LEFT, 100)
                                                .Set(Am_TOP, 100)
                                                .Set(Am_WIDTH, 100)
                                                .Set(Am_HEIGHT, 100)
                                                .Set(Am_FILL_STYLE, Am_Cyan))
                                  .Add_Part(Am_Button.Create()
                                                .Set(Am_LEFT, 150)
                                                .Set(Am_TOP, 175)))
                          .Add_Part(
                              Am_Fade_Group.Create()
                                  .Set(Am_WIDTH, 300)
                                  .Set(Am_HEIGHT, 300)
                                  .Set(Am_VALUE, Am_From_Owner(Am_VALUE))
                                  .Add_Part(
                                      Am_Group.Create()
                                          .Set(Am_WIDTH, Am_Width_Of_Parts)
                                          .Set(Am_HEIGHT, Am_Height_Of_Parts)
                                          .Add_Part(
                                              Am_Rectangle.Create()
                                                  .Set(Am_WIDTH, 100)
                                                  .Set(Am_HEIGHT, 100)
                                                  .Set(Am_FILL_STYLE, Am_Blue))
                                          .Add_Part(
                                              Am_Roundtangle.Create()
                                                  .Set(Am_LEFT, 75)
                                                  .Set(Am_TOP, 175)
                                                  .Set(Am_WIDTH, 150)
                                                  .Set(Am_HEIGHT, 100)
                                                  .Set(Am_FILL_STYLE, Am_Red)))
                                  .Add_Part(Am_Line.Create()
                                                .Set(Am_X1, 300)
                                                .Set(Am_Y1, 0)
                                                .Set(Am_X2, 0)
                                                .Set(Am_Y2, 300)
                                                .Set(Am_LINE_STYLE, Am_Green))
                                  .Add_Part(Am_Arrow_Line.Create()
                                                .Set(Am_X1, 200)
                                                .Set(Am_Y1, 0)
                                                .Set(Am_X2, 0)
                                                .Set(Am_Y2, 200)
                                                .Set(Am_LINE_STYLE, Am_Purple))
                                  .Add_Part(
                                      Am_Polygon.Create()
                                          .Set(Am_WIDTH, 100)
                                          .Set(Am_HEIGHT, 100)
                                          .Set(Am_POINT_LIST, Am_Point_List()
                                                                  .Add(170, 50)
                                                                  .Add(200, 10)
                                                                  .Add(230, 50))
                                          .Set(Am_LINE_STYLE, Am_Line_2)
                                          //              .Set (Am_FILL_STYLE, Am_Yellow)
                                          .Set(Am_FILL_STYLE, Am_No_Style))
                                  .Add_Part(Am_Arc.Create()
                                                .Set(Am_LEFT, 200)
                                                .Set(Am_TOP, 150)
                                                .Set(Am_WIDTH, 100)
                                                .Set(Am_HEIGHT, 100)
                                                .Set(Am_FILL_STYLE,
                                                     Am_Opaque_Diamond_Stipple))
                                  .Add_Part(Am_Bitmap.Create()
                                                .Set(Am_LEFT, 175)
                                                .Set(Am_TOP, 100)
                                                .Set(Am_IMAGE, ship_image)
                                                .Set(Am_LINE_STYLE, Am_Orange)
                                                .Set(Am_DRAW_MONOCHROME, true))
                                  .Add_Part(
                                      Am_Line.Create()
                                          .Set(Am_X1, 50)
                                          .Set(Am_Y1, 150)
                                          .Set(Am_X2, 150)
                                          .Set(Am_Y2, 250)
                                          .Set(Am_LINE_STYLE,
                                               Am_Style(
                                                   0.0f, 0.0f, 1.0f, 4,
                                                   Am_CAP_BUTT, Am_JOIN_MITER,
                                                   Am_LINE_ON_OFF_DASH,
                                                   Am_DOTTED_DASH_LIST, 2)))
                                  .Add_Part(Am_Text.Create()
                                                .Set(Am_TEXT, "This is a test")
                                                .Set(Am_LEFT, 180)
                                                .Set(Am_TOP, 30))
                                  .Add_Part(
                                      Am_Radio_Button_Panel.Create()
                                          .Set(Am_TOP, 110)
                                          .Set(Am_LEFT, 20)
                                          .Set(Am_ITEMS,
                                               Am_Value_List().Add("Radio").Add(
                                                   "Buttons")))
                                  .Add_Part(
                                      Am_Checkbox_Panel.Create()
                                          .Set(Am_TOP, 150)
                                          .Set(Am_LEFT, 20)
                                          .Set(Am_ITEMS,
                                               Am_Value_List().Add("Check").Add(
                                                   "Boxes")))
                                  .Add_Part(Am_Button.Create()
                                                .Set(Am_TOP, 200)
                                                .Set(Am_LEFT, 20))
                                  .Add_Part(
                                      Am_Button.Create()
                                          .Set(Am_TOP, 240)
                                          .Set(Am_LEFT, 20)
                                          .Set(Am_LEAVE_ROOM_FOR_FRINGE, false))
                                  .Add_Part(Am_Text_Input_Widget.Create()
                                                .Set(Am_TOP, 280)
                                                .Set(Am_LEFT, 20))
                              // MISSING
                              //  menu_draw
                              //  menu_item_draw
                              //  scroll_arrow_draw
                              //  scroll_draw
                              //  scrolling_group_draw
                              //  selection_handles_draw
                              //  text_input_draw
                              //  border_rectangle_draw
                              )
                          .Add_Part(Am_Rectangle.Create()
                                        .Set(Am_LEFT, 175)
                                        .Set(Am_TOP, 150)
                                        .Set(Am_WIDTH, 100)
                                        .Set(Am_HEIGHT, 100)
                                        .Set(Am_FILL_STYLE, Am_Purple))
                          .Add_Part(Am_Button.Create()
                                        .Set(Am_LEFT, 10)
                                        .Set(Am_TOP, 50)))));

  Am_Main_Event_Loop();
  Am_Cleanup();

  return 0;
}